

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

int __thiscall QFilePrivate::copy(QFilePrivate *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  int iVar2;
  QFlags<QIODeviceBase::OpenModeFlag> QVar3;
  uint uVar4;
  FileError FVar5;
  QFile *this_00;
  undefined4 extraout_var;
  ulong uVar6;
  QSaveFile *this_01;
  QSaveFilePrivate *pQVar7;
  undefined4 extraout_var_01;
  QString *a;
  QString *in_RCX;
  int __oflag;
  long in_FS_OFFSET;
  qint64 in;
  TriStateResult r;
  QFile *q;
  QString s;
  QSaveFile out;
  char block [4096];
  undefined4 in_stack_ffffffffffffed98;
  FileError in_stack_ffffffffffffed9c;
  enum_type in_stack_ffffffffffffeda0;
  enum_type in_stack_ffffffffffffeda4;
  undefined4 in_stack_ffffffffffffeda8;
  undefined4 in_stack_ffffffffffffedac;
  undefined4 in_stack_ffffffffffffedb0;
  int in_stack_ffffffffffffedb4;
  QString *in_stack_ffffffffffffedb8;
  QString *in_stack_ffffffffffffedc0;
  QString *in_stack_ffffffffffffedc8;
  undefined1 *__s;
  undefined8 in_stack_ffffffffffffede8;
  QChar QVar8;
  QFlagsStorage<QFileDevice::Permission> permissions;
  undefined1 local_1171;
  QChar local_1152 [37];
  undefined1 *local_1108;
  undefined1 *puStack_1100;
  undefined1 *local_10f8;
  QChar local_10a2 [37];
  QSaveFile local_1058;
  QChar local_103a [25];
  undefined1 local_1008 [4096];
  long local_8;
  undefined4 extraout_var_00;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(this);
  iVar2 = (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
            super_QObjectData._vptr_QObjectData[7])();
  uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar2),dst);
  if ((uVar6 & 1) == 0) {
    QVar3 = ::operator|(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0);
    uVar4 = (*(this_00->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xd])
                      (this_00,(ulong)(uint)QVar3.
                                            super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                            .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
    if ((uVar4 & 1) == 0) {
      QFile::tr((char *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
                (char *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                in_stack_ffffffffffffed9c);
      QVar8.ucs = (char16_t)((ulong)in_stack_ffffffffffffede8 >> 0x30);
      QChar::QChar<char16_t,_true>(local_103a,L' ');
      QString::arg<QString,_true>
                (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb4,QVar8
                );
      QFileDevicePrivate::setError
                ((QFileDevicePrivate *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0)
                 ,in_stack_ffffffffffffed9c,(QString *)0x2a4d2b);
      QString::~QString((QString *)0x2a4d3a);
      QString::~QString((QString *)0x2a4d47);
      local_1171 = 0;
    }
    else {
      local_1058.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
           (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      local_1058.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
           (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
      QSaveFile::QSaveFile((QSaveFile *)in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
      QSaveFile::setDirectWriteFallback
                ((QSaveFile *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                 SUB41(in_stack_ffffffffffffed9c >> 0x18,0));
      QVar3 = ::operator|(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0);
      uVar4 = QSaveFile::open(&local_1058,
                              (char *)(ulong)(uint)QVar3.
                                                  super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                                  .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.
                                                  i,__oflag);
      if ((uVar4 & 1) == 0) {
        (*(this_00->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])();
        QVar8.ucs = (char16_t)((ulong)in_stack_ffffffffffffede8 >> 0x30);
        QFile::tr((char *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
                  (char *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                  in_stack_ffffffffffffed9c);
        QIODevice::errorString
                  ((QIODevice *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
        QChar::QChar<char16_t,_true>(local_10a2,L' ');
        QString::arg<QString,_true>
                  (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb4,
                   QVar8);
        QFileDevicePrivate::setError
                  ((QFileDevicePrivate *)
                   CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                   in_stack_ffffffffffffed9c,(QString *)0x2a4ebc);
        QString::~QString((QString *)0x2a4ecb);
        QString::~QString((QString *)0x2a4ed8);
        QString::~QString((QString *)0x2a4ee5);
        local_1171 = 0;
      }
      else {
        iVar2 = (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
                  super_QObjectData._vptr_QObjectData[7])();
        this_01 = (QSaveFile *)CONCAT44(extraout_var_00,iVar2);
        pQVar7 = QSaveFile::d_func((QSaveFile *)0x2a4fb7);
        iVar2 = (*(pQVar7->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
                  super_QObjectData._vptr_QObjectData[7])();
        iVar2 = (*(this_01->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x20])
                          (this_01,CONCAT44(extraout_var_01,iVar2));
        if ((char)iVar2 == '\0') {
          (*(this_00->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])();
          QFile::tr((char *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
                    (char *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                    in_stack_ffffffffffffed9c);
          (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
            super_QObjectData._vptr_QObjectData[7])();
          QAbstractFileEngine::errorString
                    ((QAbstractFileEngine *)
                     CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
          QString::arg<QString_const&,QString>
                    (in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
          QFileDevicePrivate::setError
                    ((QFileDevicePrivate *)
                     CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                     in_stack_ffffffffffffed9c,(QString *)0x2a50a8);
          QString::~QString((QString *)0x2a50b7);
          QString::~QString((QString *)0x2a50c4);
          QString::~QString((QString *)0x2a50d1);
          local_1171 = 0;
        }
        else {
          do {
            permissions.i = (Int)((ulong)in_stack_ffffffffffffede8 >> 0x20);
            if ((char)iVar2 != -1) {
LAB_002a5430:
              in_stack_ffffffffffffedb4 =
                   (*(this_00->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x1f])
                             ();
              QFileDevice::setPermissions
                        ((QFileDevice *)in_stack_ffffffffffffedc0,(Permissions)permissions.i);
              (*(this_00->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])();
              bVar1 = QSaveFile::commit(this_01);
              in_stack_ffffffffffffedb0 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffedb0);
              if (bVar1) {
                local_1171 = 1;
              }
              else {
                FVar5 = QFileDevice::error((QFileDevice *)
                                           CONCAT44(in_stack_ffffffffffffeda4,
                                                    in_stack_ffffffffffffeda0));
                QIODevice::errorString((QIODevice *)CONCAT44(FVar5,in_stack_ffffffffffffeda8));
                QFileDevicePrivate::setError
                          ((QFileDevicePrivate *)
                           CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                           in_stack_ffffffffffffed9c,(QString *)0x2a54f6);
                QString::~QString((QString *)0x2a5505);
                local_1171 = 0;
              }
              goto LAB_002a5541;
            }
            __s = local_1008;
            memset(__s,0xaa,0x1000);
            a = (QString *)
                QIODevice::read((QIODevice *)this_00,(int)__s,(void *)0x1000,(size_t)in_RCX);
            permissions.i = (Int)((ulong)in_stack_ffffffffffffede8 >> 0x20);
            if (a == (QString *)0x0) goto LAB_002a5430;
            if ((long)a < 0) {
              local_1108 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_1100 = &DAT_aaaaaaaaaaaaaaaa;
              local_10f8 = &DAT_aaaaaaaaaaaaaaaa;
              QString::QString((QString *)
                               CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                               (QString *)
                               CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
              (*(this_00->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])();
              QFileDevicePrivate::setError
                        ((QFileDevicePrivate *)
                         CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                         in_stack_ffffffffffffed9c,(QString *)0x2a5246);
              local_1171 = 0;
              QString::~QString((QString *)0x2a5268);
              goto LAB_002a5541;
            }
            in_RCX = (QString *)
                     QIODevice::write((QIODevice *)&local_1058,(int)local_1008,a,(size_t)in_RCX);
            in_stack_ffffffffffffedc0 = in_RCX;
          } while (a == in_RCX);
          (*(this_00->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])();
          QVar8.ucs = (char16_t)((ulong)in_stack_ffffffffffffede8 >> 0x30);
          QFile::tr((char *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),
                    (char *)CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                    in_stack_ffffffffffffed9c);
          QIODevice::errorString
                    ((QIODevice *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
          QChar::QChar<char16_t,_true>(local_1152,L' ');
          QString::arg<QString,_true>(in_RCX,a,in_stack_ffffffffffffedb4,QVar8);
          QFileDevicePrivate::setError
                    ((QFileDevicePrivate *)
                     CONCAT44(in_stack_ffffffffffffeda4,in_stack_ffffffffffffeda0),
                     in_stack_ffffffffffffed9c,(QString *)0x2a5372);
          QString::~QString((QString *)0x2a5381);
          QString::~QString((QString *)0x2a538e);
          QString::~QString((QString *)0x2a539b);
          local_1171 = 0;
        }
      }
LAB_002a5541:
      QSaveFile::~QSaveFile
                ((QSaveFile *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0));
    }
  }
  else {
    local_1171 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_1171);
}

Assistant:

bool QFilePrivate::copy(const QString &newName)
{
    Q_Q(QFile);
    Q_ASSERT(error == QFile::NoError);
    Q_ASSERT(!q->isOpen());

    // Some file engines can perform this copy more efficiently (e.g., Windows
    // calling CopyFile).
    if (engine()->copy(newName))
        return true;

    if (!q->open(QFile::ReadOnly | QFile::Unbuffered)) {
        setError(QFile::CopyError, QFile::tr("Cannot open %1 for input").arg(fileName));
        return false;
    }

    QSaveFile out(newName);
    out.setDirectWriteFallback(true);
    if (!out.open(QIODevice::WriteOnly | QIODevice::Unbuffered)) {
        q->close();
        setError(QFile::CopyError, QFile::tr("Cannot open for output: %1").arg(out.errorString()));
        return false;
    }

    // Attempt to do an OS-level data copy
    QAbstractFileEngine::TriStateResult r = engine()->cloneTo(out.d_func()->engine());
    if (r == QAbstractFileEngine::TriStateResult::Failed) {
        q->close();
        setError(QFile::CopyError, QFile::tr("Could not copy to %1: %2")
                 .arg(newName, engine()->errorString()));
        return false;
    }

    while (r == QAbstractFileEngine::TriStateResult::NotSupported) {
        // OS couldn't do it, so do a block-level copy
        char block[4096];
        qint64 in = q->read(block, sizeof(block));
        if (in == 0)
            break;      // eof
        if (in < 0) {
            // Unable to read from the source. Save the error from read() above.
            QString s = std::move(errorString);
            q->close();
            setError(QFile::CopyError, std::move(s));
            return false;
        }
        if (in != out.write(block, in)) {
            q->close();
            setError(QFile::CopyError, QFile::tr("Failure to write block: %1")
                     .arg(out.errorString()));
            return false;
        }
    }

    // copy the permissions
    out.setPermissions(q->permissions());
    q->close();

    // final step: commit the copy
    if (out.commit())
        return true;
    setError(out.error(), out.errorString());
    return false;
}